

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::
OnCallSpec<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int)>
::Matches(OnCallSpec<void_(fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  tuple<testing::Matcher<fmt::BasicStringRef<char>_>,_testing::Matcher<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&>,_testing::Matcher<int>_>
  *in_RDI;
  tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int>
  *in_stack_00000008;
  MatcherBase<const_std::tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int>_&>
  *in_stack_00000010;
  tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int>
  *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<fmt::BasicStringRef<char>>,testing::Matcher<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>>&>,testing::Matcher<int>>,std::tuple<fmt::BasicStringRef<char>,mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,MultiObjMockProblemBuilder,mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>>&,int>>
                    (in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    local_11 = MatcherBase<const_std::tuple<fmt::BasicStringRef<char>,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_&,_int>_&>
               ::Matches(in_stack_00000010,in_stack_00000008);
  }
  return local_11;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }